

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchable.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::
matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::repeat(matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,quant_spec *param_2,
        sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *param_3)

{
  source_location *this_00;
  regex_error *in_stack_ffffffffffffff80;
  error_type in_stack_ffffffffffffff8c;
  regex_error *in_stack_ffffffffffffff90;
  
  regex_error::regex_error
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(char *)in_stack_ffffffffffffff80);
  this_00 = (source_location *)&stack0xffffffffffffff90;
  source_location::source_location
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O0/KWStyle/Utilities/boost/xpressive/detail/dynamic/matchable.hpp"
             ,0x4a,
             "virtual void boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::repeat(const quant_spec &, sequence<BidiIter> &) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>]"
             ,0);
  throw_exception<boost::xpressive::regex_error>(in_stack_ffffffffffffff80,this_00);
}

Assistant:

virtual void repeat(quant_spec const &, sequence<BidiIter> &) const
    {
        BOOST_THROW_EXCEPTION(
            regex_error(regex_constants::error_badrepeat, "expression cannot be quantified")
        );
    }